

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::to_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id,
          bool register_expression_read)

{
  TypedID<(spirv_cross::Types)0> *pTVar1;
  uint uVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  Variant *pVVar5;
  size_t sVar6;
  long lVar7;
  bool bVar8;
  uint32_t uVar9;
  uint32_t type;
  int index;
  SPIRExpression *pSVar10;
  __node_base_ptr p_Var11;
  SPIRVariable *var;
  _func_int **pp_Var12;
  SPIRConstant *c;
  long *plVar13;
  size_type sVar14;
  SPIRType *pSVar15;
  mapped_type *pmVar16;
  runtime_error *prVar17;
  size_type *psVar18;
  char **ts_1;
  ulong uVar19;
  ulong uVar20;
  size_type sVar21;
  pointer pcVar22;
  __node_base_ptr p_Var23;
  TypedID<(spirv_cross::Types)0> *pTVar24;
  uint32_t local_7c;
  string local_78;
  char *local_58 [2];
  char local_48 [16];
  _Alloc_hider local_38;
  
  uVar19 = (ulong)id;
  do {
    local_7c = (uint32_t)uVar19;
    uVar20 = (this->super_Compiler).invalid_expressions._M_h._M_bucket_count;
    uVar19 = uVar19 % uVar20;
    p_Var3 = (this->super_Compiler).invalid_expressions._M_h._M_buckets[uVar19];
    p_Var11 = (__node_base_ptr)0x0;
    if ((p_Var3 != (__node_base_ptr)0x0) &&
       (p_Var11 = p_Var3, p_Var23 = p_Var3->_M_nxt,
       *(uint32_t *)&p_Var3->_M_nxt[1]._M_nxt != local_7c)) {
      while (p_Var4 = p_Var23->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var11 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var4[1]._M_nxt % uVar20 != uVar19) ||
           (p_Var11 = p_Var23, p_Var23 = p_Var4, *(uint *)&p_Var4[1]._M_nxt == local_7c))
        goto LAB_001e4bf8;
      }
      p_Var11 = (__node_base_ptr)0x0;
    }
LAB_001e4bf8:
    if ((p_Var11 != (__node_base_ptr)0x0) && (p_Var11->_M_nxt != (_Hash_node_base *)0x0)) {
      handle_invalid_expression(this,local_7c);
    }
    pVVar5 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
    if (pVVar5[local_7c].type == TypeExpression) {
      pSVar10 = Variant::get<spirv_cross::SPIRExpression>(pVVar5 + local_7c);
      sVar6 = (pSVar10->expression_dependencies).
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
      if (sVar6 != 0) {
        pTVar24 = (pSVar10->expression_dependencies).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
        pTVar1 = pTVar24 + sVar6;
        do {
          uVar9 = pTVar24->id;
          uVar19 = (this->super_Compiler).invalid_expressions._M_h._M_bucket_count;
          uVar20 = (ulong)uVar9 % uVar19;
          p_Var3 = (this->super_Compiler).invalid_expressions._M_h._M_buckets[uVar20];
          p_Var11 = (__node_base_ptr)0x0;
          if ((p_Var3 != (__node_base_ptr)0x0) &&
             (p_Var11 = p_Var3, p_Var23 = p_Var3->_M_nxt,
             uVar9 != *(uint32_t *)&p_Var3->_M_nxt[1]._M_nxt)) {
            while (p_Var4 = p_Var23->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
              p_Var11 = (__node_base_ptr)0x0;
              if (((ulong)*(uint *)&p_Var4[1]._M_nxt % uVar19 != uVar20) ||
                 (p_Var11 = p_Var23, p_Var23 = p_Var4, uVar9 == *(uint *)&p_Var4[1]._M_nxt))
              goto LAB_001e4ca5;
            }
            p_Var11 = (__node_base_ptr)0x0;
          }
LAB_001e4ca5:
          if ((p_Var11 != (__node_base_ptr)0x0) && (p_Var11->_M_nxt != (_Hash_node_base *)0x0)) {
            handle_invalid_expression(this,uVar9);
          }
          pTVar24 = pTVar24 + 1;
        } while (pTVar24 != pTVar1);
      }
    }
    if ((register_expression_read & 1U) != 0) {
      track_expression_read(this,local_7c);
    }
    uVar19 = (ulong)local_7c;
    pVVar5 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr + uVar19;
    if (pVVar5->type != TypeVariable) {
      switch(pVVar5->type) {
      case TypeConstant:
        c = Variant::get<spirv_cross::SPIRConstant>(pVVar5);
        pSVar15 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(c->super_IVariant).field_0xc);
        bVar8 = Compiler::has_decoration
                          (&this->super_Compiler,(ID)(c->super_IVariant).self.id,DecorationBuiltIn);
        if (bVar8) {
          uVar9 = Compiler::get_decoration
                            (&this->super_Compiler,(ID)(c->super_IVariant).self.id,DecorationBuiltIn
                            );
          (*(this->super_Compiler)._vptr_Compiler[0x14])(__return_storage_ptr__,this,(ulong)uVar9,8)
          ;
          return __return_storage_ptr__;
        }
        if (c->specialization == true) {
          if (((this->backend).workgroup_size_is_hidden == true) &&
             (index = get_constant_mapping_to_workgroup_component(this,c), -1 < index)) {
            ts_1 = (char **)0x1;
            (*(this->super_Compiler)._vptr_Compiler[0x14])(&local_78,this,0x19);
            local_38._M_p = vector_swizzle(1,index);
            join<std::__cxx11::string,char_const*>
                      (__return_storage_ptr__,(spirv_cross *)&local_78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_38,ts_1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p);
            }
            if (*(int *)&(pSVar15->super_IVariant).field_0xc == 8) {
              return __return_storage_ptr__;
            }
            bitcast_expression(&local_78,this,pSVar15,UInt,__return_storage_ptr__);
            ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p == &local_78.field_2) {
              return __return_storage_ptr__;
            }
            goto LAB_001e50ce;
          }
        }
        else if (((c->is_used_as_lut != true) &&
                 ((*(int *)&(pSVar15->super_IVariant).field_0xc != 0xf ||
                  ((this->backend).can_declare_struct_inline != false)))) &&
                (((pSVar15->array).super_VectorView<unsigned_int>.buffer_size == 0 ||
                 ((this->backend).can_declare_arrays_inline != false)))) {
          constant_expression_abi_cxx11_(__return_storage_ptr__,this,c,false);
          return __return_storage_ptr__;
        }
LAB_001e5165:
        uVar19 = (ulong)local_7c;
        pp_Var12 = (this->super_Compiler)._vptr_Compiler;
LAB_001e4d9e:
        (*pp_Var12[6])(__return_storage_ptr__,this,uVar19,1);
        return __return_storage_ptr__;
      default:
        pp_Var12 = (this->super_Compiler)._vptr_Compiler;
        goto LAB_001e4d9e;
      case TypeExpression:
        goto switchD_001e4d93_caseD_8;
      case TypeCombinedImageSampler:
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,
                   "Combined image samplers have no default expression representation.","");
        ::std::runtime_error::runtime_error(prVar17,(string *)&local_78);
        *(undefined ***)prVar17 = &PTR__runtime_error_003d7e38;
        __cxa_throw(prVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      case TypeAccessChain:
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"Access chains have no default expression representation.",""
                  );
        ::std::runtime_error::runtime_error(prVar17,(string *)&local_78);
        *(undefined ***)prVar17 = &PTR__runtime_error_003d7e38;
        __cxa_throw(prVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    var = Variant::get<spirv_cross::SPIRVariable>(pVVar5);
    if ((var->statically_assigned == false) &&
       ((var->loop_variable != true || (var->loop_variable_enable != false)))) {
      if (var->deferred_declaration == true) {
        var->deferred_declaration = false;
        (*(this->super_Compiler)._vptr_Compiler[0x26])(__return_storage_ptr__,this,var);
        return __return_storage_ptr__;
      }
      sVar14 = ::std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::count(&(this->flattened_structs)._M_h,&local_7c);
      if (sVar14 == 0) {
        pmVar16 = ::std::__detail::
                  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&(this->super_Compiler).ir.meta,&(var->super_IVariant).self);
        if ((pmVar16->decoration).builtin == true) {
          (*(this->super_Compiler)._vptr_Compiler[0x14])
                    (__return_storage_ptr__,this,(ulong)(pmVar16->decoration).builtin_type,
                     (ulong)var->storage);
          return __return_storage_ptr__;
        }
        goto LAB_001e5165;
      }
      (*(this->super_Compiler)._vptr_Compiler[6])(&local_78,this,(ulong)local_7c,1);
      pSVar15 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                           + *(uint *)&(var->super_IVariant).field_0xc);
      load_flattened_struct(__return_storage_ptr__,this,&local_78,pSVar15);
      goto LAB_001e50c0;
    }
    uVar2 = (var->static_expression).id;
    uVar19 = (ulong)uVar2;
    register_expression_read = true;
  } while ((uVar2 != 0) || (uVar2 = (var->initializer).id, uVar19 = (ulong)uVar2, uVar2 != 0));
  uVar9 = ParsedIR::increase_bound_by(&(this->super_Compiler).ir,1);
  type = Compiler::get_variable_data_type_id(&this->super_Compiler,var);
  pSVar10 = emit_uninitialized_temporary_expression(this,type,uVar9);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar22 = (pSVar10->expression)._M_dataplus._M_p;
  sVar21 = (pSVar10->expression)._M_string_length;
LAB_001e4d6d:
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar22,pcVar22 + sVar21);
  return __return_storage_ptr__;
switchD_001e4d93_caseD_8:
  pSVar10 = Variant::get<spirv_cross::SPIRExpression>(pVVar5);
  uVar9 = *(uint32_t *)&(pSVar10->super_IVariant).field_0xc;
  if (uVar9 != 0) {
    to_enclosed_expression_abi_cxx11_(&local_78,this,uVar9,true);
    plVar13 = (long *)::std::__cxx11::string::_M_append
                                ((char *)&local_78,(ulong)(pSVar10->expression)._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar18 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar18) {
      lVar7 = plVar13[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar18;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar7;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar13;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar18;
    }
    __return_storage_ptr__->_M_string_length = plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
LAB_001e50c0:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) {
      return __return_storage_ptr__;
    }
LAB_001e50ce:
    operator_delete(local_78._M_dataplus._M_p);
    return __return_storage_ptr__;
  }
  if (pSVar10->need_transpose == true) {
    uVar9 = Compiler::get_extended_decoration
                      (&this->super_Compiler,local_7c,SPIRVCrossDecorationPhysicalTypeID);
    bVar8 = Compiler::has_extended_decoration
                      (&this->super_Compiler,local_7c,SPIRVCrossDecorationPhysicalTypePacked);
    pcVar22 = (pSVar10->expression)._M_dataplus._M_p;
    local_58[0] = local_48;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,pcVar22,pcVar22 + (pSVar10->expression)._M_string_length);
    pSVar15 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                         (pSVar10->expression_type).id);
    (*(this->super_Compiler)._vptr_Compiler[0x29])
              (__return_storage_ptr__,this,local_58,pSVar15,(ulong)uVar9,(ulong)bVar8);
    local_78._M_dataplus._M_p = local_58[0];
    if (local_58[0] == local_48) {
      return __return_storage_ptr__;
    }
    goto LAB_001e50ce;
  }
  sVar14 = ::std::
           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::count(&(this->flattened_structs)._M_h,&local_7c);
  if (sVar14 != 0) {
    pSVar15 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                         (pSVar10->expression_type).id);
    load_flattened_struct(__return_storage_ptr__,this,&pSVar10->expression,pSVar15);
    return __return_storage_ptr__;
  }
  bVar8 = Compiler::is_forcing_recompilation(&this->super_Compiler);
  if (bVar8) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"_","");
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar22 = (pSVar10->expression)._M_dataplus._M_p;
  sVar21 = (pSVar10->expression)._M_string_length;
  goto LAB_001e4d6d;
}

Assistant:

string CompilerGLSL::to_expression(uint32_t id, bool register_expression_read)
{
	auto itr = invalid_expressions.find(id);
	if (itr != end(invalid_expressions))
		handle_invalid_expression(id);

	if (ir.ids[id].get_type() == TypeExpression)
	{
		// We might have a more complex chain of dependencies.
		// A possible scenario is that we
		//
		// %1 = OpLoad
		// %2 = OpDoSomething %1 %1. here %2 will have a dependency on %1.
		// %3 = OpDoSomethingAgain %2 %2. Here %3 will lose the link to %1 since we don't propagate the dependencies like that.
		// OpStore %1 %foo // Here we can invalidate %1, and hence all expressions which depend on %1. Only %2 will know since it's part of invalid_expressions.
		// %4 = OpDoSomethingAnotherTime %3 %3 // If we forward all expressions we will see %1 expression after store, not before.
		//
		// However, we can propagate up a list of depended expressions when we used %2, so we can check if %2 is invalid when reading %3 after the store,
		// and see that we should not forward reads of the original variable.
		auto &expr = get<SPIRExpression>(id);
		for (uint32_t dep : expr.expression_dependencies)
			if (invalid_expressions.find(dep) != end(invalid_expressions))
				handle_invalid_expression(dep);
	}

	if (register_expression_read)
		track_expression_read(id);

	switch (ir.ids[id].get_type())
	{
	case TypeExpression:
	{
		auto &e = get<SPIRExpression>(id);
		if (e.base_expression)
			return to_enclosed_expression(e.base_expression) + e.expression;
		else if (e.need_transpose)
		{
			// This should not be reached for access chains, since we always deal explicitly with transpose state
			// when consuming an access chain expression.
			uint32_t physical_type_id = get_extended_decoration(id, SPIRVCrossDecorationPhysicalTypeID);
			bool is_packed = has_extended_decoration(id, SPIRVCrossDecorationPhysicalTypePacked);
			return convert_row_major_matrix(e.expression, get<SPIRType>(e.expression_type), physical_type_id,
			                                is_packed);
		}
		else if (flattened_structs.count(id))
		{
			return load_flattened_struct(e.expression, get<SPIRType>(e.expression_type));
		}
		else
		{
			if (is_forcing_recompilation())
			{
				// During first compilation phase, certain expression patterns can trigger exponential growth of memory.
				// Avoid this by returning dummy expressions during this phase.
				// Do not use empty expressions here, because those are sentinels for other cases.
				return "_";
			}
			else
				return e.expression;
		}
	}

	case TypeConstant:
	{
		auto &c = get<SPIRConstant>(id);
		auto &type = get<SPIRType>(c.constant_type);

		// WorkGroupSize may be a constant.
		if (has_decoration(c.self, DecorationBuiltIn))
			return builtin_to_glsl(BuiltIn(get_decoration(c.self, DecorationBuiltIn)), StorageClassGeneric);
		else if (c.specialization)
		{
			if (backend.workgroup_size_is_hidden)
			{
				int wg_index = get_constant_mapping_to_workgroup_component(c);
				if (wg_index >= 0)
				{
					auto wg_size = join(builtin_to_glsl(BuiltInWorkgroupSize, StorageClassInput), vector_swizzle(1, wg_index));
					if (type.basetype != SPIRType::UInt)
						wg_size = bitcast_expression(type, SPIRType::UInt, wg_size);
					return wg_size;
				}
			}

			return to_name(id);
		}
		else if (c.is_used_as_lut)
			return to_name(id);
		else if (type.basetype == SPIRType::Struct && !backend.can_declare_struct_inline)
			return to_name(id);
		else if (!type.array.empty() && !backend.can_declare_arrays_inline)
			return to_name(id);
		else
			return constant_expression(c);
	}

	case TypeConstantOp:
		return to_name(id);

	case TypeVariable:
	{
		auto &var = get<SPIRVariable>(id);
		// If we try to use a loop variable before the loop header, we have to redirect it to the static expression,
		// the variable has not been declared yet.
		if (var.statically_assigned || (var.loop_variable && !var.loop_variable_enable))
		{
			// We might try to load from a loop variable before it has been initialized.
			// Prefer static expression and fallback to initializer.
			if (var.static_expression)
				return to_expression(var.static_expression);
			else if (var.initializer)
				return to_expression(var.initializer);
			else
			{
				// We cannot declare the variable yet, so have to fake it.
				uint32_t undef_id = ir.increase_bound_by(1);
				return emit_uninitialized_temporary_expression(get_variable_data_type_id(var), undef_id).expression;
			}
		}
		else if (var.deferred_declaration)
		{
			var.deferred_declaration = false;
			return variable_decl(var);
		}
		else if (flattened_structs.count(id))
		{
			return load_flattened_struct(to_name(id), get<SPIRType>(var.basetype));
		}
		else
		{
			auto &dec = ir.meta[var.self].decoration;
			if (dec.builtin)
				return builtin_to_glsl(dec.builtin_type, var.storage);
			else
				return to_name(id);
		}
	}

	case TypeCombinedImageSampler:
		// This type should never be taken the expression of directly.
		// The intention is that texture sampling functions will extract the image and samplers
		// separately and take their expressions as needed.
		// GLSL does not use this type because OpSampledImage immediately creates a combined image sampler
		// expression ala sampler2D(texture, sampler).
		SPIRV_CROSS_THROW("Combined image samplers have no default expression representation.");

	case TypeAccessChain:
		// We cannot express this type. They only have meaning in other OpAccessChains, OpStore or OpLoad.
		SPIRV_CROSS_THROW("Access chains have no default expression representation.");

	default:
		return to_name(id);
	}
}